

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2.c
# Opt level: O1

void f_outer(uint64_t *h,uint8_t *blk,uint64_t offset_hi,uint64_t offset_lo,uint final)

{
  uint i;
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint64_t m [16];
  uint64_t local_168;
  uint64_t local_160;
  uint64_t local_158;
  uint64_t local_150;
  ulong local_148 [2];
  uint64_t local_138;
  uint64_t uStack_130;
  uint64_t local_128;
  uint64_t uStack_120;
  uint64_t local_118;
  uint64_t uStack_110;
  ulong local_108 [8];
  uint64_t *local_c8;
  ulong local_c0;
  long local_b8 [17];
  
  lVar1 = 0;
  do {
    local_b8[lVar1] = *(long *)(blk + lVar1 * 8);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  local_148[0] = *h;
  local_148[1] = h[1];
  local_138 = h[2];
  uStack_130 = h[3];
  local_128 = h[4];
  uStack_120 = h[5];
  local_118 = h[6];
  uStack_110 = h[7];
  local_108[0] = 0x6a09e667f3bcc908;
  local_108[1] = 0xbb67ae8584caa73b;
  local_108[2] = 0x3c6ef372fe94f82b;
  local_108[3] = 0xa54ff53a5f1d36f1;
  local_108[7] = 0x5be0cd19137e2179;
  local_108[4] = offset_lo ^ 0x510e527fade682d1;
  local_108[5] = offset_hi ^ 0x9b05688c2b3e6c1f;
  local_108[6] = -(ulong)final ^ 0x1f83d9abfb41bd6b;
  local_150 = 0x6a09e667f3bcc908;
  local_168 = 0xbb67ae8584caa73b;
  local_158 = 0x3c6ef372fe94f82b;
  local_108[7] = 0x5be0cd19137e2179;
  lVar1 = 0xf;
  local_160 = 0xa54ff53a5f1d36f1;
  do {
    local_c0 = (ulong)*(byte *)((long)iv + lVar1 + 0x31);
    uVar4 = local_148[0] + local_128 + local_b8[local_c0];
    uVar5 = local_148[1] + uStack_120 + local_b8[*(byte *)((long)iv + lVar1 + 0x33)];
    local_108[4] = local_108[4] ^ uVar4;
    uVar2 = local_108[4] << 0x20 | local_108[4] >> 0x20;
    local_108[5] = local_108[5] ^ uVar5;
    uVar3 = local_108[5] << 0x20 | local_108[5] >> 0x20;
    local_150 = local_150 + uVar2;
    local_168 = local_168 + uVar3;
    uVar12 = local_138 + local_118 + local_b8[*(byte *)((long)iv + lVar1 + 0x35)];
    uVar8 = local_128 ^ local_150;
    uVar6 = uStack_120 ^ local_168;
    local_108[6] = local_108[6] ^ uVar12;
    uVar9 = uVar8 << 0x28 | uVar8 >> 0x18;
    uVar8 = local_108[6] << 0x20 | local_108[6] >> 0x20;
    uVar6 = uVar6 << 0x28 | uVar6 >> 0x18;
    local_158 = local_158 + uVar8;
    uVar10 = local_118 ^ local_158;
    uVar11 = uVar10 << 0x28 | uVar10 >> 0x18;
    uVar4 = uVar4 + local_b8[*(byte *)((long)iv + lVar1 + 0x32)] + uVar9;
    uVar5 = uVar5 + local_b8[*(byte *)((long)iv + lVar1 + 0x34)] + uVar6;
    uVar13 = uVar12 + local_b8[*(byte *)((long)iv + lVar1 + 0x36)] + uVar11;
    uVar2 = uVar2 ^ uVar4;
    uVar12 = uStack_130 + uStack_110 + local_b8[*(byte *)((long)iv + lVar1 + 0x37)];
    uVar3 = uVar3 ^ uVar5;
    uVar8 = uVar8 ^ uVar13;
    uVar10 = local_108[7] ^ uVar12;
    uVar2 = uVar2 << 0x30 | uVar2 >> 0x10;
    uVar7 = uVar10 << 0x20 | uVar10 >> 0x20;
    uVar3 = uVar3 << 0x30 | uVar3 >> 0x10;
    local_160 = local_160 + uVar7;
    uVar8 = uVar8 << 0x30 | uVar8 >> 0x10;
    uVar10 = uStack_110 ^ local_160;
    uVar10 = uVar10 << 0x28 | uVar10 >> 0x18;
    local_150 = local_150 + uVar2;
    uVar12 = uVar12 + local_b8[*(byte *)((long)iv + lVar1 + 0x38)] + uVar10;
    local_168 = local_168 + uVar3;
    uVar7 = uVar7 ^ uVar12;
    uVar7 = uVar7 << 0x30 | uVar7 >> 0x10;
    local_158 = local_158 + uVar8;
    uVar9 = uVar9 ^ local_150;
    uVar6 = uVar6 ^ local_168;
    uVar11 = uVar11 ^ local_158;
    uVar9 = uVar9 << 1 | (ulong)((long)uVar9 < 0);
    uVar6 = uVar6 << 1 | (ulong)((long)uVar6 < 0);
    local_160 = local_160 + uVar7;
    uVar11 = uVar11 << 1 | (ulong)((long)uVar11 < 0);
    uVar4 = uVar4 + local_b8[*(byte *)((long)iv + lVar1 + 0x39)] + uVar6;
    uVar7 = uVar7 ^ uVar4;
    uVar10 = uVar10 ^ local_160;
    uVar10 = uVar10 << 1 | (ulong)((long)uVar10 < 0);
    uVar5 = uVar5 + local_b8[*(byte *)((long)iv + lVar1 + 0x3b)] + uVar11;
    uVar2 = uVar2 ^ uVar5;
    uVar13 = uVar13 + local_b8[*(byte *)((long)iv + lVar1 + 0x3d)] + uVar10;
    uVar3 = uVar3 ^ uVar13;
    uVar12 = uVar12 + uVar9 + local_b8[*(byte *)((long)iv + lVar1 + 0x3f)];
    uVar8 = uVar8 ^ uVar12;
    uVar7 = uVar7 << 0x20 | uVar7 >> 0x20;
    local_158 = local_158 + uVar7;
    uVar6 = uVar6 ^ local_158;
    uVar6 = uVar6 << 0x28 | uVar6 >> 0x18;
    uVar2 = uVar2 << 0x20 | uVar2 >> 0x20;
    local_160 = local_160 + uVar2;
    local_148[0] = uVar4 + local_b8[*(byte *)((long)iv + lVar1 + 0x3a)] + uVar6;
    uVar11 = uVar11 ^ local_160;
    uVar11 = uVar11 << 0x28 | uVar11 >> 0x18;
    uVar7 = uVar7 ^ local_148[0];
    local_148[1] = uVar5 + local_b8[*(byte *)((long)iv + lVar1 + 0x3c)] + uVar11;
    uVar3 = uVar3 << 0x20 | uVar3 >> 0x20;
    uVar2 = uVar2 ^ local_148[1];
    local_150 = local_150 + uVar3;
    uVar10 = uVar10 ^ local_150;
    local_108[7] = uVar7 << 0x30 | uVar7 >> 0x10;
    uVar4 = uVar10 << 0x28 | uVar10 >> 0x18;
    local_108[4] = uVar2 << 0x30 | uVar2 >> 0x10;
    local_158 = local_158 + local_108[7];
    local_138 = uVar13 + local_b8[*(byte *)((long)iv + lVar1 + 0x3e)] + uVar4;
    uVar3 = uVar3 ^ local_138;
    local_160 = local_160 + local_108[4];
    local_108[5] = uVar3 << 0x30 | uVar3 >> 0x10;
    local_150 = local_150 + local_108[5];
    uVar6 = uVar6 ^ local_158;
    uVar2 = uVar8 << 0x20 | uVar8 >> 0x20;
    local_168 = local_168 + uVar2;
    uVar11 = uVar11 ^ local_160;
    uVar9 = uVar9 ^ local_168;
    uVar3 = uVar9 << 0x28 | uVar9 >> 0x18;
    uVar4 = uVar4 ^ local_150;
    uStack_130 = uVar12 + local_b8[sigma[0][lVar1]] + uVar3;
    uVar2 = uVar2 ^ uStack_130;
    uStack_120 = uVar6 << 1 | (ulong)((long)uVar6 < 0);
    local_108[6] = uVar2 << 0x30 | uVar2 >> 0x10;
    local_118 = uVar11 << 1 | (ulong)((long)uVar11 < 0);
    local_168 = local_168 + local_108[6];
    uVar3 = uVar3 ^ local_168;
    uStack_110 = uVar4 << 1 | (ulong)((long)uVar4 < 0);
    local_128 = uVar3 << 1 | (ulong)((long)uVar3 < 0);
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0xcf);
  local_108[0] = local_150;
  local_108[1] = local_168;
  local_108[2] = local_158;
  local_108[3] = local_160;
  lVar1 = 0;
  do {
    h[lVar1] = h[lVar1] ^ local_108[lVar1] ^ local_148[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  local_c8 = h;
  smemclr(local_148,0x80);
  smemclr(local_b8,0x80);
  return;
}

Assistant:

static inline void f_outer(uint64_t h[8], uint8_t blk[128], uint64_t offset_hi,
                           uint64_t offset_lo, unsigned final)
{
    uint64_t m[16];
    for (unsigned i = 0; i < 16; i++)
        m[i] = GET_64BIT_LSB_FIRST(blk + 8*i);
    f(h, m, offset_hi, offset_lo, final);
    smemclr(m, sizeof(m));
}